

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O0

void __thiscall btHashedSimplePairCache::btHashedSimplePairCache(btHashedSimplePairCache *this)

{
  undefined8 *in_RDI;
  btHashedSimplePairCache *in_stack_00000010;
  int initialAllocatedSize;
  btAlignedObjectArray<btSimplePair> *this_00;
  int _Count;
  btAlignedObjectArray<btSimplePair> *this_01;
  
  *in_RDI = &PTR__btHashedSimplePairCache_002e38a0;
  this_00 = (btAlignedObjectArray<btSimplePair> *)(in_RDI + 1);
  btAlignedObjectArray<btSimplePair>::btAlignedObjectArray(this_00);
  this_01 = (btAlignedObjectArray<btSimplePair> *)(in_RDI + 5);
  btAlignedObjectArray<int>::btAlignedObjectArray((btAlignedObjectArray<int> *)this_00);
  _Count = (int)((ulong)in_RDI >> 0x20);
  btAlignedObjectArray<int>::btAlignedObjectArray((btAlignedObjectArray<int> *)this_00);
  btAlignedObjectArray<btSimplePair>::reserve(this_01,_Count);
  growTables(in_stack_00000010);
  return;
}

Assistant:

btHashedSimplePairCache::btHashedSimplePairCache() {
	int initialAllocatedSize= 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
	growTables();
}